

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O2

long __thiscall glcts::anon_unknown_0::UniformLocTypesMix::Run(UniformLocTypesMix *this)

{
  UniformValueGenerator *generator;
  long lVar1;
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  uniforms;
  Uniform local_668;
  UniformType local_490;
  UniformType local_400;
  UniformType local_370;
  UniformType local_2e0;
  UniformType local_250;
  UniformType local_1c0;
  UniformType local_130;
  UniformType local_a0;
  
  uniforms.
  super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  uniforms.
  super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uniforms.
  super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  UniformType::UniformType(&local_a0,0x1406,0);
  generator = &(this->super_ExplicitUniformLocationCaseBase).uniformValueGenerator;
  anon_unknown_0::Uniform::Uniform
            (&local_668,generator,&local_a0,(Loc)ZEXT812(2),(DefOccurence)0x0,(DefOccurence)0x0);
  std::
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ::push_back(&uniforms,&local_668);
  anon_unknown_0::Uniform::~Uniform(&local_668);
  UniformType::~UniformType(&local_a0);
  UniformType::UniformType(&local_130,0x8b51,0);
  anon_unknown_0::Uniform::Uniform
            (&local_668,generator,&local_130,(Loc)ZEXT812(3),(DefOccurence)0x0,(DefOccurence)0x0);
  std::
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ::push_back(&uniforms,&local_668);
  anon_unknown_0::Uniform::~Uniform(&local_668);
  UniformType::~UniformType(&local_130);
  UniformType::UniformType(&local_1c0,0x1405,0);
  anon_unknown_0::Uniform::Uniform
            (&local_668,generator,&local_1c0,(Loc)ZEXT812(0),(DefOccurence)0x0,(DefOccurence)0x0);
  std::
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ::push_back(&uniforms,&local_668);
  anon_unknown_0::Uniform::~Uniform(&local_668);
  UniformType::~UniformType(&local_1c0);
  UniformType::UniformType(&local_250,0x8b54,0);
  anon_unknown_0::Uniform::Uniform
            (&local_668,generator,&local_250,(Loc)ZEXT812(1),(DefOccurence)0x0,(DefOccurence)0x0);
  std::
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ::push_back(&uniforms,&local_668);
  anon_unknown_0::Uniform::~Uniform(&local_668);
  UniformType::~UniformType(&local_250);
  UniformType::UniformType(&local_2e0,0x8b5a,0);
  anon_unknown_0::Uniform::Uniform
            (&local_668,generator,&local_2e0,(Loc)ZEXT812(4),(DefOccurence)0x0,(DefOccurence)0x0);
  std::
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ::push_back(&uniforms,&local_668);
  anon_unknown_0::Uniform::~Uniform(&local_668);
  UniformType::~UniformType(&local_2e0);
  UniformType::UniformType(&local_370,0x8b5a,0);
  anon_unknown_0::Uniform::Uniform
            (&local_668,generator,&local_370,(Loc)ZEXT812(7),(DefOccurence)0x0,(DefOccurence)0x0);
  std::
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ::push_back(&uniforms,&local_668);
  anon_unknown_0::Uniform::~Uniform(&local_668);
  UniformType::~UniformType(&local_370);
  UniformType::UniformType(&local_400,0x8b5a,0);
  anon_unknown_0::Uniform::Uniform
            (&local_668,generator,&local_400,(Loc)ZEXT812(5),(DefOccurence)0x0,(DefOccurence)0x0);
  std::
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ::push_back(&uniforms,&local_668);
  anon_unknown_0::Uniform::~Uniform(&local_668);
  UniformType::~UniformType(&local_400);
  UniformType::UniformType(&local_490,0x8b5b,0);
  anon_unknown_0::Uniform::Uniform
            (&local_668,generator,&local_490,(Loc)ZEXT812(6),(DefOccurence)0x0,(DefOccurence)0x0);
  std::
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ::push_back(&uniforms,&local_668);
  anon_unknown_0::Uniform::~Uniform(&local_668);
  UniformType::~UniformType(&local_490);
  lVar1 = ExplicitUniformLocationCaseBase::doRun
                    (&this->super_ExplicitUniformLocationCaseBase,&uniforms);
  std::
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ::~vector(&uniforms);
  return lVar1;
}

Assistant:

virtual long Run()
	{
		//layout (location = 2) uniform float u0;
		//layout (location = 3) uniform vec3  u1;
		//layout (location = 0) uniform uint  u2;
		//layout (location = 1) uniform ivec3 u3;
		//layout (location = 4) uniform mat2  u4;
		//layout (location = 7) uniform mat2  u5;
		//layout (location = 5) uniform mat2  u6;
		//layout (location = 6) uniform mat3  u7;
		std::vector<Uniform> uniforms;
		uniforms.push_back(Uniform(uniformValueGenerator, GL_FLOAT, Loc::C(2)));
		uniforms.push_back(Uniform(uniformValueGenerator, GL_FLOAT_VEC3, Loc::C(3)));
		uniforms.push_back(Uniform(uniformValueGenerator, GL_UNSIGNED_INT, Loc::C(0)));
		uniforms.push_back(Uniform(uniformValueGenerator, GL_INT_VEC3, Loc::C(1)));
		uniforms.push_back(Uniform(uniformValueGenerator, GL_FLOAT_MAT2, Loc::C(4)));
		uniforms.push_back(Uniform(uniformValueGenerator, GL_FLOAT_MAT2, Loc::C(7)));
		uniforms.push_back(Uniform(uniformValueGenerator, GL_FLOAT_MAT2, Loc::C(5)));
		uniforms.push_back(Uniform(uniformValueGenerator, GL_FLOAT_MAT3, Loc::C(6)));
		return doRun(uniforms);
	}